

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_pod(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *cclass;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cclass_00;
  char *extraout_RDX_03;
  char *pcVar8;
  char *extraout_RDX_04;
  int yypos1032;
  int yythunkpos1032;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchString(G,"=begin ");
  if ((iVar4 != 0) &&
     (iVar4 = yymatchClass(G,(uchar *)"",cclass), pcVar8 = extraout_RDX, iVar4 != 0)) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchClass(G,(uchar *)"",pcVar8);
      pcVar8 = extraout_RDX_00;
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchChar(G,0x20);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,10);
    if (iVar4 != 0) {
      yyDo(G,yy_1_pod,G->begin,G->end,"yy_1_pod");
      do {
        iVar4 = G->pos;
        iVar3 = G->thunkpos;
        iVar5 = yymatchString(G,"=end ");
        iVar7 = 9;
        if (iVar5 == 0) {
          G->pos = iVar4;
          G->thunkpos = iVar3;
          iVar7 = 0;
        }
        if (iVar7 == 9) {
LAB_00104921:
          G->pos = iVar4;
          G->thunkpos = iVar3;
          iVar7 = 0;
        }
        else {
          pcVar8 = extraout_RDX_01;
          if (iVar7 == 0) {
            do {
              iVar5 = G->pos;
              iVar7 = G->thunkpos;
              iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_326d,pcVar8);
              pcVar8 = extraout_RDX_02;
            } while (iVar6 != 0);
            G->pos = iVar5;
            G->thunkpos = iVar7;
            iVar5 = yymatchChar(G,10);
            if (iVar5 == 0) goto LAB_00104921;
            yyDo(G,yy_2_pod,G->begin,G->end,"yy_2_pod");
            iVar7 = 7;
          }
        }
      } while (iVar7 != 0);
      iVar4 = yymatchString(G,"=end ");
      if ((iVar4 != 0) &&
         (iVar4 = yymatchClass(G,(uchar *)"",cclass_00), pcVar8 = extraout_RDX_03, iVar4 != 0)) {
        do {
          iVar4 = G->pos;
          iVar3 = G->thunkpos;
          iVar5 = yymatchClass(G,(uchar *)"",pcVar8);
          pcVar8 = extraout_RDX_04;
        } while (iVar5 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar3;
        do {
          iVar4 = G->pos;
          iVar3 = G->thunkpos;
          iVar5 = yymatchChar(G,0x20);
        } while (iVar5 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar3;
        iVar4 = yymatchChar(G,10);
        if (iVar4 != 0) {
          yyDo(G,yy_3_pod,G->begin,G->end,"yy_3_pod");
          return 1;
        }
      }
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_pod(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "pod"));
  if (!yymatchString(G, "=begin ")) goto l1025;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l1025;

  l1026:;	
  {  int yypos1027= G->pos, yythunkpos1027= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l1027;
  goto l1026;
  l1027:;	  G->pos= yypos1027; G->thunkpos= yythunkpos1027;
  }
  l1028:;	
  {  int yypos1029= G->pos, yythunkpos1029= G->thunkpos;  if (!yymatchChar(G, ' ')) goto l1029;
  goto l1028;
  l1029:;	  G->pos= yypos1029; G->thunkpos= yythunkpos1029;
  }  if (!yymatchChar(G, '\n')) goto l1025;
  yyDo(G, yy_1_pod, G->begin, G->end, "yy_1_pod");

  l1030:;	
  {  int yypos1031= G->pos, yythunkpos1031= G->thunkpos;
  {  int yypos1032= G->pos, yythunkpos1032= G->thunkpos;  if (!yymatchString(G, "=end ")) goto l1032;
  goto l1031;
  l1032:;	  G->pos= yypos1032; G->thunkpos= yythunkpos1032;
  }
  l1033:;	
  {  int yypos1034= G->pos, yythunkpos1034= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\373\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\n")) goto l1034;
  goto l1033;
  l1034:;	  G->pos= yypos1034; G->thunkpos= yythunkpos1034;
  }  if (!yymatchChar(G, '\n')) goto l1031;
  yyDo(G, yy_2_pod, G->begin, G->end, "yy_2_pod");
  goto l1030;
  l1031:;	  G->pos= yypos1031; G->thunkpos= yythunkpos1031;
  }  if (!yymatchString(G, "=end ")) goto l1025;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l1025;

  l1035:;	
  {  int yypos1036= G->pos, yythunkpos1036= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\000\000\000\000\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-z")) goto l1036;
  goto l1035;
  l1036:;	  G->pos= yypos1036; G->thunkpos= yythunkpos1036;
  }
  l1037:;	
  {  int yypos1038= G->pos, yythunkpos1038= G->thunkpos;  if (!yymatchChar(G, ' ')) goto l1038;
  goto l1037;
  l1038:;	  G->pos= yypos1038; G->thunkpos= yythunkpos1038;
  }  if (!yymatchChar(G, '\n')) goto l1025;
  yyDo(G, yy_3_pod, G->begin, G->end, "yy_3_pod");
  yyprintf((stderr, "  ok   pod"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l1025:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "pod"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}